

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::
     stringPrintfRecursive<bool_const&,bool_const&,bool_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,pstd::optional<pbrt::Bounds2<float>>const&,pstd::optional<pbrt::Bounds2<int>>const&>
               (string *s,char *fmt,bool *v,bool *args,bool *args_1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_4,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_5,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_6,
               optional<pbrt::Bounds2<float>_> *args_7,optional<pbrt::Bounds2<int>_> *args_8)

{
  long lVar1;
  ulong uVar2;
  char **v_00;
  char *in_RCX;
  string *in_RDX;
  char *pcVar3;
  string *in_RDI;
  bool *in_R8;
  bool *in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_R14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_R15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  optional<pbrt::Bounds2<float>_> *in_stack_00000008;
  optional<pbrt::Bounds2<int>_> *in_stack_00000010;
  string *in_stack_00000018;
  char *in_stack_00000020;
  string *in_stack_00000028;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  string *in_stack_fffffffffffffd40;
  char **in_stack_fffffffffffffd48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd58;
  string *fmt_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd70;
  optional<pbrt::Bounds2<float>_> *in_stack_fffffffffffffd78;
  optional<pbrt::Bounds2<int>_> *in_stack_fffffffffffffd80;
  string local_278 [32];
  undefined8 local_258;
  string local_250 [8];
  char *in_stack_fffffffffffffdb8;
  int in_stack_fffffffffffffdc4;
  char *in_stack_fffffffffffffdc8;
  stringstream local_230 [4];
  LogLevel in_stack_fffffffffffffdd4;
  undefined1 local_220 [376];
  string local_a8 [32];
  undefined4 local_88;
  undefined1 local_73;
  byte local_72;
  byte local_71;
  string local_70 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  
  copyToFormatString(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
  lVar1 = std::__cxx11::string::find((char)local_70,0x2a);
  local_71 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)local_70,0x73);
  local_72 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)local_70,100);
  local_73 = lVar1 != -1;
  if ((local_71 & 1) == 0) {
    if ((local_72 & 1) == 0) {
      if ((bool)local_73) {
        fmt_00 = local_70;
        uVar2 = std::__cxx11::string::find((char)fmt_00,100);
        IntegerFormatTrait<bool>::fmt();
        std::__cxx11::string::replace((ulong)fmt_00,uVar2,(char *)0x1);
        std::__cxx11::string::c_str();
        formatOne<bool_const&>((char *)fmt_00,(bool *)in_stack_fffffffffffffd50);
        std::__cxx11::string::operator+=(in_RDI,local_a8);
        std::__cxx11::string::~string(local_a8);
      }
      else if ((local_72 & 1) == 0) {
        uVar2 = std::__cxx11::string::empty();
        if ((uVar2 & 1) != 0) {
          LogFatal(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc4,
                   in_stack_fffffffffffffdb8);
        }
        std::__cxx11::string::c_str();
        formatOne<bool_const&>((char *)in_stack_fffffffffffffd58,(bool *)in_stack_fffffffffffffd50);
        std::__cxx11::string::operator+=(in_RDI,(string *)&stack0xfffffffffffffd68);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffd68);
      }
      else {
        std::__cxx11::stringstream::stringstream(local_230);
        std::ostream::operator<<(local_220,(bool)((byte)in_RDX->_M_dataplus & 1));
        v_00 = (char **)std::__cxx11::string::c_str();
        std::__cxx11::stringstream::str();
        local_258 = std::__cxx11::string::c_str();
        formatOne<char_const*>((char *)in_stack_fffffffffffffd58,v_00);
        std::__cxx11::string::operator+=(in_RDI,local_250);
        std::__cxx11::string::~string(local_250);
        std::__cxx11::string::~string(local_278);
        std::__cxx11::stringstream::~stringstream(local_230);
      }
    }
    else {
      pcVar3 = "false";
      if (((byte)in_RDX->_M_dataplus & 1) != 0) {
        pcVar3 = "true";
      }
      std::__cxx11::string::operator+=(in_RDI,pcVar3);
    }
    stringPrintfRecursive<bool_const&,bool_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,pstd::optional<pbrt::Bounds2<float>>const&,pstd::optional<pbrt::Bounds2<int>>const&>
              (in_RDX,in_RCX,in_R8,in_R9,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
               unaff_R14,unaff_R15,unaff_retaddr,in_stack_00000008,in_stack_00000010);
    local_88 = 0;
  }
  else {
    stringPrintfRecursiveWithPrecision<bool_const&,bool_const&,bool_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,pstd::optional<pbrt::Bounds2<float>>const&,pstd::optional<pbrt::Bounds2<int>>const&>
              (in_stack_00000028,in_stack_00000020,in_stack_00000018,(bool *)in_stack_00000010,
               (bool *)in_stack_00000008,in_R9,in_stack_fffffffffffffd50,in_stack_fffffffffffffd58,
               in_stack_fffffffffffffd60,in_stack_fffffffffffffd68,in_stack_fffffffffffffd70,
               in_stack_fffffffffffffd78,in_stack_fffffffffffffd80);
    local_88 = 1;
  }
  std::__cxx11::string::~string(local_70);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}